

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.hh
# Opt level: O3

bool __thiscall
tchecker::algorithms::couvscc::
single_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::accepting
          (single_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t> *this
          ,node_sptr_t *n,zg_t *ts,
          dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *labels)

{
  ulong uVar1;
  pointer puVar2;
  bool bVar3;
  bool bVar4;
  long lVar5;
  ulong uVar6;
  make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL> *pmVar7;
  overflow_error *this_00;
  ulong uVar8;
  const_state_sptr_t local_38;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_30;
  
  puVar2 = (labels->m_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar5 = (long)(labels->m_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar2;
  if (lVar5 == 0) {
LAB_0012d189:
    bVar3 = false;
  }
  else {
    uVar6 = lVar5 >> 3;
    if (*puVar2 == 0) {
      uVar8 = 0;
      do {
        if ((uVar6 + (uVar6 == 0)) - 1 == uVar8) goto LAB_0012d189;
        uVar1 = uVar8 + 1;
        lVar5 = uVar8 + 1;
        uVar8 = uVar1;
      } while (puVar2[lVar5] == 0);
      if (uVar6 <= uVar1) goto LAB_0012d189;
    }
    if (n->_t == (make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>
                  *)0x0) {
      __assert_fail("_t != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/shared_objects.hh"
                    ,0x1db,
                    "T *tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t, tchecker::tck_liveness::zg_couvscc::edge_t>>>::operator->() const [T = tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t, tchecker::tck_liveness::zg_couvscc::edge_t>>]"
                   );
    }
    local_38._t = (n->_t->
                  super_node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>
                  ).super_node_t.super_node_zg_state_t._state._t;
    if ((local_38._t != (make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL> *)0x0) &&
       (pmVar7 = (make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL> *)
                 ((long)&((local_38._t[-1].super_state_t._zone._t)->super_zone_t)._dim + 1),
       local_38._t[-1].super_state_t._zone._t = pmVar7,
       pmVar7 == (make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL> *)0xfffffffffffffffe)) {
      this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
      std::overflow_error::overflow_error(this_00,"reference counter overflow");
      __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
    }
    zg::zg_t::labels(&local_30,ts,&local_38);
    bVar3 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::is_subset_of
                      (labels,&local_30);
    bVar4 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::m_check_invariants
                      (&local_30);
    if (!bVar4) {
      __assert_fail("m_check_invariants()","/usr/include/boost/dynamic_bitset/dynamic_bitset.hpp",
                    0x2be,
                    "boost::dynamic_bitset<>::~dynamic_bitset() [Block = unsigned long, Allocator = std::allocator<unsigned long>]"
                   );
    }
    if (local_30.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_30.m_bits.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_30.m_bits.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_30.m_bits.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
    ::~intrusive_shared_ptr_t(&local_38);
  }
  return bVar3;
}

Assistant:

bool accepting(node_sptr_t & n, TS & ts, boost::dynamic_bitset<> const & labels) const
  {
    return !labels.none() && labels.is_subset_of(ts.labels(n->state_ptr()));
  }